

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::InputScalarEx
               (char *label,ImGuiDataType data_type,void *data_ptr,void *step_ptr,
               void *step_fast_ptr,char *scalar_format,ImGuiInputTextFlags extra_flags)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  ImVec2 button_sz;
  ImVec2 label_size;
  float local_88;
  char buf [64];
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    label_size = IVar3;
    BeginGroup();
    PushID(label);
    IVar1 = (pIVar4->Style).FramePadding;
    fVar9 = IVar1.x;
    fVar8 = IVar1.y;
    fVar9 = pIVar4->FontSize + fVar9 + fVar9;
    button_sz.y = pIVar4->FontSize + fVar8 + fVar8;
    button_sz.x = fVar9;
    if (step_ptr != (void *)0x0) {
      fVar8 = CalcItemWidth();
      fVar9 = fVar9 + (pIVar4->Style).ItemInnerSpacing.x;
      fVar8 = fVar8 - (fVar9 + fVar9);
      fVar9 = 1.0;
      if (1.0 <= fVar8) {
        fVar9 = fVar8;
      }
      PushItemWidth(fVar9);
    }
    if (data_type == ImGuiDataType_Float) {
      ImFormatString(buf,0x40,scalar_format,SUB84((double)*data_ptr,0));
    }
    else if (data_type == ImGuiDataType_Int) {
      ImFormatString(buf,0x40,scalar_format,(ulong)*data_ptr);
    }
    bVar6 = false;
    bVar5 = InputText("",buf,0x40,(uint)((extra_flags & 2U) == 0) | extra_flags | 0x10,
                      (ImGuiTextEditCallback)0x0,(void *)0x0);
    if (bVar5) {
      bVar6 = DataTypeApplyOpFromText
                        (buf,(GImGui->InputTextState).InitialText.Data,data_type,data_ptr,
                         scalar_format);
    }
    if (step_ptr != (void *)0x0) {
      PopItemWidth();
      SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
      bVar5 = ButtonEx("-",&button_sz,0x41);
      if (bVar5) {
        pvVar7 = step_ptr;
        if ((pIVar4->IO).KeyCtrl != false) {
          pvVar7 = step_fast_ptr;
        }
        if (step_fast_ptr == (void *)0x0) {
          pvVar7 = step_ptr;
        }
        DataTypeApplyOp(data_type,0x2d,data_ptr,pvVar7);
        bVar6 = true;
      }
      SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
      bVar5 = ButtonEx("+",&button_sz,0x41);
      if (bVar5) {
        pvVar7 = step_ptr;
        if ((pIVar4->IO).KeyCtrl != false) {
          pvVar7 = step_fast_ptr;
        }
        if (step_fast_ptr == (void *)0x0) {
          pvVar7 = step_ptr;
        }
        DataTypeApplyOp(data_type,0x2b,data_ptr,pvVar7);
        bVar6 = true;
      }
    }
    PopID();
    local_88 = IVar3.x;
    if (0.0 < local_88) {
      SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
      IVar1.y = (pIVar2->DC).CursorPos.y + (pIVar4->Style).FramePadding.y;
      IVar1.x = (pIVar2->DC).CursorPos.x;
      RenderText(IVar1,label,(char *)0x0,true);
      ItemSize(&label_size,(pIVar4->Style).FramePadding.y);
    }
    EndGroup();
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::InputScalarEx(const char* label, ImGuiDataType data_type, void* data_ptr, void* step_ptr, void* step_fast_ptr, const char* scalar_format, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    BeginGroup();
    PushID(label);
    const ImVec2 button_sz = ImVec2(g.FontSize, g.FontSize) + style.FramePadding*2.0f;
    if (step_ptr)
        PushItemWidth(ImMax(1.0f, CalcItemWidth() - (button_sz.x + style.ItemInnerSpacing.x)*2));

    char buf[64];
    DataTypeFormatString(data_type, data_ptr, scalar_format, buf, IM_ARRAYSIZE(buf));

    bool value_changed = false;
    if (!(extra_flags & ImGuiInputTextFlags_CharsHexadecimal))
        extra_flags |= ImGuiInputTextFlags_CharsDecimal;
    extra_flags |= ImGuiInputTextFlags_AutoSelectAll;
    if (InputText("", buf, IM_ARRAYSIZE(buf), extra_flags)) // PushId(label) + "" gives us the expected ID from outside point of view
        value_changed = DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, scalar_format);

    // Step buttons
    if (step_ptr)
    {
        PopItemWidth();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '-', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '+', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
    }
    PopID();

    if (label_size.x > 0)
    {
        SameLine(0, style.ItemInnerSpacing.x);
        RenderText(ImVec2(window->DC.CursorPos.x, window->DC.CursorPos.y + style.FramePadding.y), label);
        ItemSize(label_size, style.FramePadding.y);
    }
    EndGroup();

    return value_changed;
}